

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *pObj)

{
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  Abc_NtkFunc_t AVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  DdManager *dd;
  void *pvVar7;
  void **ppvVar8;
  Flow_Data_t *pFVar9;
  Flow_Data_t FVar10;
  Flow_Data_t FVar11;
  MinRegMan_t *pMVar12;
  uint uVar13;
  int iVar14;
  undefined8 in_RAX;
  DdNode *pDVar15;
  DdNode *f;
  char *pSop;
  int *piVar16;
  int in_EDX;
  int Fill;
  undefined8 *puVar17;
  Hop_Man_t *pHop;
  long lVar18;
  undefined8 local_38;
  
  uVar13 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar13 == 5) {
    return;
  }
  if (uVar13 == 2) {
    __assert_fail("!Abc_ObjIsPi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0xbc,"void Abc_FlowRetime_UpdateForwardInit_rec(Abc_Obj_t *)");
  }
  pAVar5 = pObj->pNtk;
  iVar14 = pObj->Id;
  local_38 = in_RAX;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar14 + 1,in_EDX);
  if (((long)iVar14 < 0) || ((pAVar5->vTravIds).nSize <= iVar14)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar6 = pObj->pNtk;
  iVar3 = pAVar6->nTravIds;
  if ((pAVar5->vTravIds).pArray[iVar14] == iVar3) {
    return;
  }
  iVar14 = pObj->Id;
  Vec_IntFillExtra(&pAVar6->vTravIds,iVar14 + 1,Fill);
  if (((long)iVar14 < 0) || ((pAVar6->vTravIds).nSize <= iVar14)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar6->vTravIds).pArray[iVar14] = iVar3;
  if (0 < (pObj->vFanins).nSize) {
    lVar18 = 0;
    do {
      Abc_FlowRetime_UpdateForwardInit_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar18]]);
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pObj->vFanins).nSize);
  }
  uVar13 = *(uint *)&pObj->field_0x14;
  if ((uVar13 & 0xf) == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x12f,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  puVar17 = (undefined8 *)((ulong)pObj & 0xfffffffffffffffe);
  if (puVar17 == (undefined8 *)0x0) {
    __assert_fail("Abc_ObjRegular(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                  ,0x130,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
  }
  pAVar5 = pObj->pNtk;
  dd = (DdManager *)pAVar5->pManFunc;
  f = (DdNode *)(pObj->field_5).pData;
  if (pAVar5->ntkType == ABC_NTK_STRASH) {
    if (*(int *)*puVar17 != 3) {
      __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
    }
    if ((*(uint *)((long)puVar17 + 0x14) & 0xf) != 1) goto LAB_004e03dc;
LAB_004e0354:
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
LAB_004e0371:
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 0x40;
  }
  else {
    if ((uVar13 & 0xf) == 7) {
      iVar14 = Abc_NodeIsConst0(pObj);
      if (iVar14 == 0) {
        iVar14 = Abc_NodeIsConst1(pObj);
        if (iVar14 != 0) goto LAB_004e0354;
        uVar13 = *(uint *)&pObj->field_0x14;
        goto LAB_004e03dc;
      }
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
    }
    else {
LAB_004e03dc:
      pMVar12 = pManMR;
      if ((uVar13 & 0xf) != 7) {
        uVar2 = *(ushort *)
                 (pManMR->pDataArray +
                 *(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x10));
        pFVar9 = pManMR->pDataArray + (uint)pObj->Id;
        *(ushort *)pFVar9 = *(ushort *)pFVar9 & 0xff9f;
        if ((uVar2 & 0x60) == 0) {
          return;
        }
        *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) |
             (ushort)((uVar13 >> 10 & 1) != (uint)((uVar2 >> 6 & 1) != 0)) * 0x20 + 0x20;
        return;
      }
      AVar4 = pAVar5->ntkFunc;
      piVar16 = (int *)(ulong)AVar4;
      if (AVar4 == ABC_FUNC_AIG) {
        if (pAVar5->ntkType != ABC_NTK_STRASH) {
          pHop = (Hop_Man_t *)(pObj->field_5).pData;
          if (pHop == (Hop_Man_t *)0x0) {
            __assert_fail("pObj->pData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x172,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
          }
          iVar14 = (pObj->vFanins).nSize;
          if (*(int *)&dd->acache < iVar14) {
            __assert_fail("Abc_ObjFaninNum(pObj) <= Hop_ManPiNum(pHop)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x173,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
          }
          if (0 < iVar14) {
            piVar16 = (int *)0x0;
            do {
              if ((long)*(int *)(*(long *)&dd->sentinel + 4) <= (long)piVar16) goto LAB_004e07b3;
              pvVar7 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[(long)piVar16]];
              lVar18 = *(long *)(*(long *)(*(long *)&dd->sentinel + 8) + (long)piVar16 * 8);
              *(uint *)(lVar18 + 0x20) =
                   *(uint *)(lVar18 + 0x20) & 0xffffffef |
                   *(uint *)(pMVar12->pDataArray + *(uint *)((long)pvVar7 + 0x10)) >> 2 & 0x10;
              if ((long)*(int *)(*(long *)&dd->sentinel + 4) <= (long)piVar16) goto LAB_004e07b3;
              lVar18 = *(long *)(*(long *)(*(long *)&dd->sentinel + 8) + (long)piVar16 * 8);
              *(uint *)(lVar18 + 0x20) =
                   *(uint *)(lVar18 + 0x20) & 0xffffffdf |
                   (uint)((undefined1  [24])
                          ((undefined1  [24])pMVar12->pDataArray[*(uint *)((long)pvVar7 + 0x10)] &
                          (undefined1  [24])0x60) != (undefined1  [24])0x0) << 5;
              piVar16 = (int *)((long)piVar16 + 1);
            } while ((long)piVar16 < (long)(pObj->vFanins).nSize);
            pHop = (Hop_Man_t *)(pObj->field_5).pData;
          }
          Abc_FlowRetime_EvalHop_rec
                    (pHop,(Hop_Obj_t *)((long)&local_38 + 4),(int *)&local_38,piVar16);
          Abc_FlowRetime_SetInitValue(pObj,local_38._4_4_,(int)local_38);
          if ((pObj->vFanins).nSize < 1) {
            return;
          }
          lVar18 = 0;
          while (lVar18 < *(int *)(*(long *)&dd->sentinel + 4)) {
            puVar1 = (uint *)(*(long *)(*(long *)(*(long *)&dd->sentinel + 8) + lVar18 * 8) + 0x20);
            *puVar1 = *puVar1 & 0xffffffef;
            if (*(int *)(*(long *)&dd->sentinel + 4) <= lVar18) break;
            puVar1 = (uint *)(*(long *)(*(long *)(*(long *)&dd->sentinel + 8) + lVar18 * 8) + 0x20);
            *puVar1 = *puVar1 & 0xffffffdf;
            lVar18 = lVar18 + 1;
            if ((pObj->vFanins).nSize <= lVar18) {
              return;
            }
          }
LAB_004e07b3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
      }
      else {
        if (AVar4 == ABC_FUNC_BDD) {
          if (dd == (DdManager *)0x0) {
            __assert_fail("dd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x155,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
          }
          if (f != (DdNode *)0x0) {
            if (0 < (pObj->vFanins).nSize) {
              lVar18 = 0;
              do {
                pvVar7 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar18]];
                pDVar15 = Cudd_bddIthVar(dd,(int)lVar18);
                if ((undefined1  [24])
                    ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)] &
                    (undefined1  [24])0x60) != (undefined1  [24])0x0) {
                  if ((undefined1  [24])
                      ((undefined1  [24])pManMR->pDataArray[*(uint *)((long)pvVar7 + 0x10)] &
                      (undefined1  [24])0x20) != (undefined1  [24])0x0) {
                    pDVar15 = (DdNode *)((ulong)pDVar15 ^ 1);
                  }
                  f = Cudd_Cofactor(dd,f,pDVar15);
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < (pObj->vFanins).nSize);
            }
            pDVar15 = Cudd_ReadOne(dd);
            iVar14 = *(int *)((ulong)f & 0xfffffffffffffffe);
            *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
                 *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
            if (iVar14 != 0x7fffffff) {
              return;
            }
            *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
                 *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) |
                 (ushort)(f == pDVar15) * 0x20 + 0x20;
            return;
          }
          __assert_fail("pBdd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                        ,0x156,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
        }
        if (AVar4 == ABC_FUNC_SOP) {
          pSop = (char *)(pObj->field_5).pData;
LAB_004e076c:
          Abc_FlowRetime_SimulateSop(pObj,pSop);
          return;
        }
        if (pAVar5->ntkType != ABC_NTK_STRASH) {
          if (AVar4 != ABC_FUNC_MAP) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretInit.c"
                          ,0x1a6,"void Abc_FlowRetime_SimulateNode(Abc_Obj_t *)");
          }
          pSop = Mio_GateReadSop((Mio_Gate_t *)(pObj->field_5).pData);
          goto LAB_004e076c;
        }
      }
      piVar16 = (pObj->vFanins).pArray;
      ppvVar8 = pObj->pNtk->vObjs->pArray;
      pFVar9 = pManMR->pDataArray;
      FVar10 = pFVar9[*(uint *)((long)ppvVar8[*piVar16] + 0x10)];
      FVar11 = pFVar9[*(uint *)((long)ppvVar8[piVar16[1]] + 0x10)];
      if (((uVar13 >> 0xb & 1 ^
           (uint)((undefined1  [24])((undefined1  [24])FVar11 & (undefined1  [24])0x20) ==
                 (undefined1  [24])0x0)) &
          (uVar13 >> 10 ^
          (uint)((undefined1  [24])((undefined1  [24])FVar10 & (undefined1  [24])0x20) ==
                (undefined1  [24])0x0))) != 0) {
        *(ushort *)(pFVar9 + (uint)pObj->Id) = *(ushort *)(pFVar9 + (uint)pObj->Id) & 0xff9f;
        if ((undefined1  [24])((undefined1  [24])FVar10 & (undefined1  [24])0x60) ==
            (undefined1  [24])0x0) {
          return;
        }
        if ((undefined1  [24])((undefined1  [24])FVar11 & (undefined1  [24])0x60) ==
            (undefined1  [24])0x0) {
          return;
        }
        goto LAB_004e0371;
      }
      *(ushort *)(pFVar9 + (uint)pObj->Id) = *(ushort *)(pFVar9 + (uint)pObj->Id) & 0xff9f;
    }
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 0x20;
  }
  return;
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit_rec( Abc_Obj_t * pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPi(pObj)); // should never reach the inputs

  if (Abc_ObjIsBo(pObj)) return;

  // visited?
  if (Abc_NodeIsTravIdCurrent(pObj)) return;
  Abc_NodeSetTravIdCurrent(pObj);

  Abc_ObjForEachFanin( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateForwardInit_rec( pNext );
  }
  
  Abc_FlowRetime_SimulateNode( pObj );
}